

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

bool __thiscall
wallet::CWallet::SubmitTxMemoryPoolAndRelay
          (CWallet *this,CWalletTx *wtx,string *err_string,bool relay)

{
  Chain *pCVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  bool bVar2;
  char cVar3;
  int iVar4;
  long in_FS_OFFSET;
  undefined1 in_stack_ffffffffffffff98 [16];
  _Alloc_hider in_stack_ffffffffffffffa8;
  size_type in_stack_ffffffffffffffb0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->fBroadcastTransactions == true) &&
     ((*(__index_type *)
        ((long)&(wtx->m_state).
                super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                .
                super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                .
                super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                .
                super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                .
                super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                .
                super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
        + 0x28) != '\x03' ||
      ((*(byte *)&(wtx->m_state).
                  super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  .
                  super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  .
                  super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  .
                  super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  .
                  super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  .
                  super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  ._M_u & 1) == 0)))) {
    bVar2 = CTransaction::IsCoinBase
                      ((wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if (!bVar2) {
      iVar4 = GetTxDepthInMainChain(this,wtx);
      if (iVar4 == 0) {
        base_blob<256u>::ToString_abi_cxx11_
                  ((string *)&stack0xffffffffffffffa8,
                   &((wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash);
        parameters.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffffa8._M_p;
        parameters._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff98._0_8_;
        parameters._M_string_length = in_stack_ffffffffffffff98._8_8_;
        parameters.field_2._8_8_ = in_stack_ffffffffffffffb0;
        WalletLogPrintf<std::__cxx11::string>
                  (this,"Submitting wtx %s to mempool for relay\n",parameters);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_ffffffffffffffa8._M_p != &local_48) {
          operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
        }
        pCVar1 = this->m_chain;
        if (pCVar1 == (Chain *)0x0) {
          __assert_fail("m_chain",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                        ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
        }
        cVar3 = (**(code **)(*(long *)pCVar1 + 0xa8))
                          (pCVar1,&wtx->tx,&this->m_default_max_tx_fee,relay,err_string);
        if (cVar3 != '\0') {
          std::
          variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
          ::operator=((variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
                       *)&wtx->m_state,(TxStateInMempool *)&stack0xffffffffffffffa7);
        }
        goto LAB_0016521c;
      }
    }
  }
  cVar3 = '\0';
LAB_0016521c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)cVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::SubmitTxMemoryPoolAndRelay(CWalletTx& wtx, std::string& err_string, bool relay) const
{
    AssertLockHeld(cs_wallet);

    // Can't relay if wallet is not broadcasting
    if (!GetBroadcastTransactions()) return false;
    // Don't relay abandoned transactions
    if (wtx.isAbandoned()) return false;
    // Don't try to submit coinbase transactions. These would fail anyway but would
    // cause log spam.
    if (wtx.IsCoinBase()) return false;
    // Don't try to submit conflicted or confirmed transactions.
    if (GetTxDepthInMainChain(wtx) != 0) return false;

    // Submit transaction to mempool for relay
    WalletLogPrintf("Submitting wtx %s to mempool for relay\n", wtx.GetHash().ToString());
    // We must set TxStateInMempool here. Even though it will also be set later by the
    // entered-mempool callback, if we did not there would be a race where a
    // user could call sendmoney in a loop and hit spurious out of funds errors
    // because we think that this newly generated transaction's change is
    // unavailable as we're not yet aware that it is in the mempool.
    //
    // If broadcast fails for any reason, trying to set wtx.m_state here would be incorrect.
    // If transaction was previously in the mempool, it should be updated when
    // TransactionRemovedFromMempool fires.
    bool ret = chain().broadcastTransaction(wtx.tx, m_default_max_tx_fee, relay, err_string);
    if (ret) wtx.m_state = TxStateInMempool{};
    return ret;
}